

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O3

void __thiscall
brynet::net::TcpService::postSessionAsyncProc
          (TcpService *this,SESSION_TYPE id,function<void_(brynet::net::DataSocket_*)> *callback)

{
  _Manager_type p_Var1;
  EventLoop *this_00;
  undefined8 uVar2;
  undefined8 this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined1 auVar4 [8];
  type callbackCapture;
  shared_ptr<const_brynet::net::TcpService> shared_this;
  _Any_data local_d8;
  _Manager_type local_c8;
  _Invoker_type local_c0;
  undefined1 local_b8 [24];
  __pthread_internal_list *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined1 local_90 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 auStack_50 [8];
  USER_PROC local_48;
  
  getIOLoopDataBySocketID((TcpService *)local_b8,(SESSION_TYPE)this);
  uVar2 = local_b8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = 0;
    local_c8 = (_Manager_type)0x0;
    local_c0 = callback->_M_invoker;
    p_Var1 = (callback->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_d8._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
      local_d8._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
      (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
      callback->_M_invoker = (_Invoker_type)0x0;
      local_c8 = p_Var1;
    }
    std::__shared_ptr<brynet::net::TcpService_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<brynet::net::TcpService,void>
              ((__shared_ptr<brynet::net::TcpService_const,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
               (__weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<brynet::net::TcpService>);
    this_01 = local_b8._8_8_;
    local_b8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_b8._8_8_ = (element_type *)0x0;
    this_00 = (EventLoop *)
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar2 + 0x10))->
              _vptr__Sp_counted_base;
    std::function<void_(brynet::net::DataSocket_*)>::function
              ((function<void_(brynet::net::DataSocket_*)> *)local_90,
               (function<void_(brynet::net::DataSocket_*)> *)&local_d8);
    local_90._40_8_ = local_a0;
    p_Stack_60 = local_98;
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_98->_M_use_count = local_98->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_98->_M_use_count = local_98->_M_use_count + 1;
      }
    }
    local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
    auStack_50 = (undefined1  [8])this_01;
    if ((element_type *)this_01 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((enable_shared_from_this<brynet::net::TcpService> *)(this_01 + 8))->_M_weak_this)
                 .super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((enable_shared_from_this<brynet::net::TcpService> *)(this_01 + 8))->
                      _M_weak_this).
                      super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             1;
        UNLOCK();
      }
      else {
        *(int *)&(((enable_shared_from_this<brynet::net::TcpService> *)(this_01 + 8))->_M_weak_this)
                 .super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((enable_shared_from_this<brynet::net::TcpService> *)(this_01 + 8))->
                      _M_weak_this).
                      super___weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             1;
      }
    }
    local_48.super__Function_base._M_manager = (_Manager_type)0x0;
    local_48._M_invoker = (_Invoker_type)0x0;
    local_48.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_48.super__Function_base._M_functor._8_8_ = 0;
    local_90._32_8_ = id;
    local_48.super__Function_base._M_functor._M_unused._M_object = operator_new(0x48);
    auVar4 = auStack_50;
    p_Var3 = p_Stack_60;
    *(undefined8 *)local_48.super__Function_base._M_functor._M_unused._0_8_ = 0;
    *(undefined8 *)((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 8) = 0;
    *(undefined8 *)((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = 0;
    *(undefined8 *)((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
         local_90._24_8_;
    if ((code *)local_90._16_8_ != (code *)0x0) {
      *(undefined8 *)local_48.super__Function_base._M_functor._M_unused._0_8_ = local_90._0_8_;
      *(undefined8 *)((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 8) =
           local_90._8_8_;
      *(undefined8 *)((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
           local_90._16_8_;
      local_90._16_8_ = (code *)0x0;
      local_90._24_8_ = 0;
    }
    *(undefined8 *)((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 0x20) =
         local_90._32_8_;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 0x28) =
         local_90._40_8_;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 0x30) = p_Var3;
    local_90._40_8_ = (__pthread_internal_list *)0x0;
    auStack_50 = (undefined1  [8])0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 0x38) = local_58._M_pi;
    *(undefined1 (*) [8])((long)local_48.super__Function_base._M_functor._M_unused._0_8_ + 0x40) =
         auVar4;
    local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:140:30)>
         ::_M_invoke;
    local_48.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:140:30)>
         ::_M_manager;
    EventLoop::pushAsyncProc(this_00,&local_48);
    if ((__pthread_internal_list *)local_48.super__Function_base._M_manager !=
        (__pthread_internal_list *)0x0) {
      (*local_48.super__Function_base._M_manager)(&local_48,&local_48,3);
    }
    if (auStack_50 != (undefined1  [8])0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_50);
    }
    if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
    }
    if ((code *)local_90._16_8_ != (code *)0x0) {
      (*(code *)local_90._16_8_)(local_90,local_90,3);
    }
    if ((element_type *)this_01 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
    if (local_c8 != (_Manager_type)0x0) {
      (*local_c8)(&local_d8,&local_d8,__destroy_functor);
    }
  }
  if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  return;
}

Assistant:

void TcpService::postSessionAsyncProc(SESSION_TYPE id, 
    std::function<void(DataSocket::PTR)> callback) const
{
    union  SessionId sid;
    sid.id = id;
    auto ioLoopData = getIOLoopDataBySocketID(id);
    if (ioLoopData == nullptr)
    {
        return;
    }

    const auto& eventLoop = ioLoopData->getEventLoop();
    auto callbackCapture = std::move(callback);
    auto shared_this = shared_from_this();
    auto ioLoopDataCapture = std::move(ioLoopData);
    eventLoop->pushAsyncProc([callbackCapture, 
        sid, 
        shared_this, 
        ioLoopDataCapture](){
        DataSocket::PTR tmp = nullptr;
        if (callbackCapture != nullptr &&
            ioLoopDataCapture->getDataSockets().get(sid.data.index, tmp) &&
            tmp != nullptr)
        {
            const auto ud = brynet::net::cast<SESSION_TYPE>(tmp->getUD());
            if (ud != nullptr && *ud == sid.id)
            {
                callbackCapture(tmp);
            }
        }
    });
}